

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

Var __thiscall Js::InterpreterStackFrame::ProcessAsmJsModule(InterpreterStackFrame *this)

{
  DisableImplicitFlags DVar1;
  ImplicitCallFlags IVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  FunctionBody *ptr;
  long lVar9;
  ScriptFunction *func;
  PropertyIdArray *propIds;
  code *pcVar10;
  undefined8 instance;
  bool bVar11;
  int32 iVar12;
  AsmJsModuleInfo *info;
  Recycler *pRVar13;
  WriteBarrierPtr<void> *ptr_00;
  undefined4 *puVar14;
  Var pvVar15;
  ModuleVar *pMVar16;
  ModuleVarImport *pMVar17;
  RecyclableObject *pRVar18;
  ThreadContext *pTVar19;
  PropertyRecord *pPVar20;
  ModuleFunctionImport *pMVar21;
  FrameDisplay *environment;
  ModuleFunction *pMVar22;
  FunctionInfoPtrPtr infoRef;
  AsmJsScriptFunction *function;
  Type *pTVar23;
  FunctionBody *this_00;
  AsmJsFunctionInfo *pAVar24;
  ProxyEntryPointInfo *pPVar25;
  ModuleFunctionTable *pMVar26;
  WriteBarrierPtr<void> *ptr_01;
  undefined4 extraout_var;
  JavascriptMethod p_Var27;
  Type *literalType;
  int i_2;
  ScriptContext *pSVar28;
  WriteBarrierPtr<void> *this_01;
  char16_t *pcVar29;
  int i_3;
  long lVar30;
  int i;
  int iVar31;
  uint index;
  ulong uVar32;
  void *pvVar33;
  double dVar34;
  undefined1 local_c0 [8];
  TrackAllocData data;
  
  ptr = *(FunctionBody **)(this + 0x88);
  info = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)3,Js::AsmJsModuleInfo*>
                   ((FunctionProxy *)ptr);
  if (DAT_0143bfba == '\x01') {
    pSVar28 = *(ScriptContext **)(this + 0x78);
    pcVar29 = L"Asm.js Runtime Error : Forcing link failure";
LAB_008a9d05:
    AsmJSCompiler::OutputError(pSVar28,pcVar29);
    pvVar15 = ProcessLinkFailedAsmJsModule(this);
    return pvVar15;
  }
  if (*(int *)(this + 0x18) != info->mArgInCount + 1) {
    pSVar28 = *(ScriptContext **)(this + 0x78);
    pcVar29 = L"Asm.js Runtime Error : Invalid module argument count";
    goto LAB_008a9d05;
  }
  data.plusSize = (size_t)(info->mModuleMemory).mMemorySize;
  local_c0 = (undefined1  [8])&Memory::WriteBarrierPtr<void>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_4aa05e8;
  data.filename._0_4_ = 0xa68;
  pRVar13 = Memory::Recycler::TrackAllocInfo
                      (*(Recycler **)(*(long *)(this + 0x78) + 0x1200),(TrackAllocData *)local_c0);
  ptr_00 = Memory::AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<void>,false>
                     ((Memory *)pRVar13,(Recycler *)Memory::Recycler::Alloc,0,
                      (long)(info->mModuleMemory).mMemorySize);
  lVar30 = (long)(info->mModuleMemory).mArrayBufferOffset;
  if (lVar30 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar14 = 1;
    bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                 ,0xa6a,
                                 "(moduleMemory.mArrayBufferOffset == AsmJsModuleMemory::MemoryTableBeginOffset)"
                                 ,
                                 "moduleMemory.mArrayBufferOffset == AsmJsModuleMemory::MemoryTableBeginOffset"
                                );
    if (!bVar11) {
LAB_008aa62c:
      pcVar10 = (code *)invalidInstructionException();
      (*pcVar10)();
    }
    *puVar14 = 0;
  }
  iVar31 = (info->mModuleMemory).mStdLibOffset;
  if (*(int *)(this + 0x18) < 2) {
    pvVar33 = (void *)0x0;
  }
  else {
    pvVar33 = *(void **)(*(long *)(this + 0x20) + 8);
  }
  iVar3 = (info->mModuleMemory).mIntOffset;
  iVar4 = (info->mModuleMemory).mFloatOffset;
  iVar5 = (info->mModuleMemory).mDoubleOffset;
  iVar6 = (info->mModuleMemory).mFFIOffset;
  iVar7 = (info->mModuleMemory).mFuncOffset;
  iVar8 = (info->mModuleMemory).mFuncPtrOffset;
  lVar9 = *(long *)(*(long *)(this + 0x78) + 0x3b8);
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(ptr_00 + iVar31,pvVar33);
  if (*(int *)(this + 0x18) < 3) {
    pvVar15 = (Var)0x0;
  }
  else {
    pvVar15 = *(Var *)(*(long *)(this + 0x20) + 0x10);
    if (*(int *)(this + 0x18) != 3) {
      pvVar33 = *(void **)(*(long *)(this + 0x20) + 0x18);
      goto LAB_008a9da4;
    }
  }
  pvVar33 = (void *)0x0;
LAB_008a9da4:
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(ptr_00 + lVar30,pvVar33);
  DVar1 = *(DisableImplicitFlags *)(lVar9 + 0x1542);
  IVar2 = *(ImplicitCallFlags *)(lVar9 + 0x1570);
  *(DisableImplicitFlags *)(lVar9 + 0x1542) = DVar1 | DisableImplicitCallFlag;
  *(undefined1 *)(lVar9 + 0x1570) = 1;
  data._32_8_ = pvVar15;
  bVar11 = ASMLink::CheckParams
                     (*(ScriptContext **)(this + 0x78),info,ptr_00[iVar31].ptr,pvVar15,
                      ptr_00[lVar30].ptr);
  if (bVar11) {
    pSVar28 = *(ScriptContext **)(this + 0x78);
    pTVar19 = pSVar28->threadContext;
    if (pTVar19->implicitCallFlags < 2) {
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      for (iVar31 = 0; iVar31 < info->mVarCount; iVar31 = iVar31 + 1) {
        pMVar16 = AsmJsModuleInfo::GetVar(info,iVar31);
        AsmJsVarType::AsmJsVarType((AsmJsVarType *)local_c0,pMVar16->type);
        if (local_c0[0] == Float) {
          *(Type *)((long)&ptr_00[iVar4].ptr + (ulong)pMVar16->location * 4) =
               (pMVar16->initialiser).intInit;
        }
        else if (local_c0[0] == Double) {
          *(Type *)(ptr_00 + (long)iVar5 + (ulong)pMVar16->location) = pMVar16->initialiser;
        }
        else if (local_c0[0] == Int) {
          *(Type *)((long)&ptr_00[iVar3].ptr + (ulong)pMVar16->location * 4) =
               (pMVar16->initialiser).intInit;
        }
        else {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar14 = 1;
          bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                       ,0xa9c,"((0))","UNREACHED");
          if (!bVar11) goto LAB_008aa62c;
          *puVar14 = 0;
        }
      }
      for (iVar31 = 0; iVar31 < info->mVarImportCount; iVar31 = iVar31 + 1) {
        pMVar17 = AsmJsModuleInfo::GetVarImport(info,iVar31);
        AsmJsVarType::AsmJsVarType((AsmJsVarType *)local_c0,pMVar17->type);
        pvVar15 = JavascriptOperators::OP_GetProperty
                            ((Var)data._32_8_,pMVar17->field,*(ScriptContext **)(this + 0x78));
        pSVar28 = *(ScriptContext **)(this + 0x78);
        pTVar19 = pSVar28->threadContext;
        if (ImplicitCall_None < pTVar19->implicitCallFlags) {
LAB_008aa0bc:
          pTVar19->disableImplicitFlags = DVar1;
          pTVar19->implicitCallFlags = IVar2;
          pPVar20 = ScriptContext::GetPropertyName(pSVar28,pMVar17->field);
          pcVar29 = L"Asm.js Runtime Error : Accessing var import %s has side effects";
          goto LAB_008aa0e8;
        }
        if ((DAT_014302fa == '\x01') && (bVar11 = TaggedNumber::Is(pvVar15), !bVar11)) {
          bVar11 = VarIs<Js::RecyclableObject>(pvVar15);
          if (bVar11) {
            pRVar18 = VarTo<Js::RecyclableObject>(pvVar15);
            bVar11 = DynamicType::Is(((pRVar18->type).ptr)->typeId);
            if (!bVar11) goto LAB_008aa027;
          }
          pSVar28 = *(ScriptContext **)(this + 0x78);
          pPVar20 = ScriptContext::GetPropertyName(pSVar28,pMVar17->field);
          pcVar29 = L"Asm.js Runtime Error : Var import %s must be primitive";
          goto LAB_008aa527;
        }
LAB_008aa027:
        if (local_c0[0] == Float) {
          dVar34 = JavascriptConversion::ToNumber(pvVar15,*(ScriptContext **)(this + 0x78));
          *(float *)((long)&ptr_00[iVar4].ptr + (ulong)pMVar17->location * 4) = (float)dVar34;
        }
        else if (local_c0[0] == Double) {
          pvVar33 = (void *)JavascriptConversion::ToNumber(pvVar15,*(ScriptContext **)(this + 0x78))
          ;
          ptr_00[(long)iVar5 + (ulong)pMVar17->location].ptr = pvVar33;
        }
        else if (local_c0[0] == Int) {
          iVar12 = JavascriptMath::ToInt32(pvVar15,*(ScriptContext **)(this + 0x78));
          *(int32 *)((long)&ptr_00[iVar3].ptr + (ulong)pMVar17->location * 4) = iVar12;
        }
        pSVar28 = *(ScriptContext **)(this + 0x78);
        pTVar19 = pSVar28->threadContext;
        if (ImplicitCall_None < pTVar19->implicitCallFlags) goto LAB_008aa0bc;
      }
      iVar31 = 0;
LAB_008aa0ff:
      instance = data._32_8_;
      if (iVar31 < info->mFunctionImportCount) {
        pMVar21 = AsmJsModuleInfo::GetFunctionImport(info,iVar31);
        pvVar15 = JavascriptOperators::OP_GetProperty
                            ((Var)instance,pMVar21->field,*(ScriptContext **)(this + 0x78));
        pSVar28 = *(ScriptContext **)(this + 0x78);
        pTVar19 = pSVar28->threadContext;
        if (ImplicitCall_None < pTVar19->implicitCallFlags) {
          pTVar19->disableImplicitFlags = DVar1;
          pTVar19->implicitCallFlags = IVar2;
          pPVar20 = ScriptContext::GetPropertyName(pSVar28,pMVar21->field);
          pcVar29 = L"Asm.js Runtime Error : Accessing foreign function import %s has side effects";
LAB_008aa0e8:
          AsmJSCompiler::OutputError(pSVar28,pcVar29,pPVar20 + 1);
          goto LAB_008aa54d;
        }
        bVar11 = VarIs<Js::JavascriptFunction>(pvVar15);
        if (bVar11) goto code_r0x008aa158;
        pSVar28 = *(ScriptContext **)(this + 0x78);
        pPVar20 = ScriptContext::GetPropertyName(pSVar28,pMVar21->field);
        pcVar29 = L"Asm.js Runtime Error : Foreign function import %s is not a function";
LAB_008aa527:
        AsmJSCompiler::OutputError(pSVar28,pcVar29,pPVar20 + 1);
        goto LAB_008aa53c;
      }
      *(DisableImplicitFlags *)(lVar9 + 0x1542) = DVar1;
      *(ImplicitCallFlags *)(lVar9 + 0x1570) = IVar2;
      local_c0 = (undefined1  [8])&FrameDisplay::typeinfo;
      data.typeinfo = (type_info *)0x8;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_4aa05e8;
      data.filename._0_4_ = 0xae7;
      pRVar13 = Memory::Recycler::TrackAllocInfo
                          (*(Recycler **)(*(long *)(this + 0x78) + 0x1200),
                           (TrackAllocData *)local_c0);
      environment = (FrameDisplay *)new<Memory::Recycler>(8,pRVar13,0x37ff80,0);
      environment->tag = true;
      environment->strictMode = false;
      environment->length = 0;
      environment->unused = 0;
      for (index = 0; (int)index < info->mFunctionCount; index = index + 1) {
        pMVar22 = AsmJsModuleInfo::GetFunction(info,index);
        infoRef = ParseableFunctionInfo::GetNestedFuncReference
                            (*(ParseableFunctionInfo **)(this + 0x88),index);
        function = AsmJsScriptFunction::OP_NewAsmJsFunc(environment,infoRef);
        Memory::WriteBarrierPtr<void>::WriteBarrierSet
                  (ptr_00 + (long)iVar7 + (ulong)pMVar22->location,function);
        pTVar23 = (function->super_ScriptFunction).super_ScriptFunctionBase.super_JavascriptFunction
                  .super_DynamicObject.super_RecyclableObject.type.ptr;
        if (pTVar23->entryPoint == JavascriptFunction::DeferredDeserializeThunk) {
          JavascriptFunction::DeferredDeserialize(&function->super_ScriptFunction);
          pTVar23 = (function->super_ScriptFunction).super_ScriptFunctionBase.
                    super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.type.ptr;
        }
        pTVar23->entryPoint = AsmJsExternalEntryPoint;
        this_00 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
        pAVar24 = FunctionProxy::
                  GetAuxPtr<(Js::FunctionProxy::AuxPointerType)2,Js::AsmJsFunctionInfo*>
                            ((FunctionProxy *)this_00);
        Memory::WriteBarrierPtr<Js::FunctionBody>::WriteBarrierSet
                  (&pAVar24->asmJsModuleFunctionBody,ptr);
        Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::WriteBarrierSet
                  (&function->m_moduleEnvironment,ptr_00);
        if (info->mIsProcessed == false) {
          pPVar25 = ScriptFunction::GetEntryPointInfo(&function->super_ScriptFunction);
          *(byte *)&pPVar25[1].super_ExpirableObject.super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
               *(byte *)&pPVar25[1].super_ExpirableObject.super_FinalizableObject.
                         super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject | 8;
          bVar11 = Phases::IsEnabled((Phases *)&DAT_01447bf0,AsmJsJITTemplatePhase);
          if (!bVar11) {
            pPVar25->jsMethod = AsmJsDelayDynamicInterpreterThunk;
          }
        }
      }
      for (lVar30 = 0; lVar30 < info->mFunctionTableCount; lVar30 = lVar30 + 1) {
        pMVar26 = AsmJsModuleInfo::GetFunctionTable(info,(int)lVar30);
        data.plusSize = (size_t)pMVar26->size;
        local_c0 = (undefined1  [8])&Memory::WriteBarrierPtr<void>::typeinfo;
        data.typeinfo = (type_info *)0x0;
        data.count = (size_t)anon_var_dwarf_4aa05e8;
        data.filename._0_4_ = 0xb11;
        pRVar13 = Memory::Recycler::TrackAllocInfo
                            (*(Recycler **)(*(long *)(this + 0x78) + 0x1200),
                             (TrackAllocData *)local_c0);
        ptr_01 = Memory::AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<void>,false>
                           ((Memory *)pRVar13,(Recycler *)Memory::Recycler::Alloc,0,
                            (ulong)pMVar26->size);
        this_01 = ptr_01;
        for (uVar32 = 0; uVar32 < pMVar26->size; uVar32 = uVar32 + 1) {
          Memory::WriteBarrierPtr<void>::WriteBarrierSet
                    (this_01,ptr_00[(long)iVar7 + (ulong)(pMVar26->moduleFunctionIndex).ptr[uVar32]]
                             .ptr);
          this_01 = this_01 + 1;
        }
        Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::WriteBarrierSet
                  ((WriteBarrierPtr<Memory::WriteBarrierPtr<void>_> *)(ptr_00 + iVar8 + lVar30),
                   ptr_01);
      }
      bVar11 = Phases::IsEnabled((Phases *)&DAT_01447bf0,AsmJsJITTemplatePhase);
      if (((bVar11) && (DAT_01441e20 == 0)) ||
         ((bVar11 = Phases::IsEnabled((Phases *)&DAT_01447bf0,AsmJsJITTemplatePhase), !bVar11 &&
          ((DAT_01441e28 == 0 || (DAT_0143bfca == '\x01')))))) {
        bVar11 = Phases::IsEnabled((Phases *)&DAT_01453738,AsmjsEntryPointInfoPhase);
        if (bVar11) {
          iVar31 = (*(ptr->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                     super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
          Output::Print(L"%s Scheduling For Full JIT at callcount:%d\n",
                        CONCAT44(extraout_var,iVar31),0);
          Output::Flush();
        }
        for (lVar30 = 0; lVar30 < info->mFunctionCount; lVar30 = lVar30 + 1) {
          func = (ScriptFunction *)ptr_00[iVar7 + lVar30].ptr;
          if (func == (ScriptFunction *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar14 = 1;
            bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                         ,0xb2b,"(functionObj != nullptr)","functionObj != nullptr")
            ;
            if (!bVar11) goto LAB_008aa62c;
            *puVar14 = 0;
          }
          p_Var27 = RecyclableObject::GetEntryPoint((RecyclableObject *)func);
          if (p_Var27 == AsmJsExternalEntryPoint) {
            WAsmJs::JitFunctionIfReady(func,0);
          }
        }
      }
      info->mIsProcessed = true;
      if (info->mExportsCount == 0) {
        pvVar33 = ptr_00[(long)iVar7 + (ulong)info->mExportFunctionIndex].ptr;
      }
      else {
        propIds = (info->mExports).ptr;
        pSVar28 = *(ScriptContext **)(this + 0x78);
        literalType = FunctionBody::GetObjectLiteralTypeRef(*(FunctionBody **)(this + 0x88),0);
        pvVar33 = JavascriptOperators::NewScObjectLiteral(pSVar28,propIds,literalType);
        for (lVar30 = 0; lVar30 < info->mExportsCount; lVar30 = lVar30 + 1) {
          JavascriptOperators::OP_InitProperty
                    (pvVar33,(&(info->mExports).ptr[1].count)[lVar30],
                     ptr_00[(long)iVar7 + (ulong)(info->mExportsFunctionLocation).ptr[lVar30]].ptr);
        }
      }
      SetReg<unsigned_int>(this,0,pvVar33);
      return pvVar33;
    }
    pTVar19->disableImplicitFlags = DVar1;
    pTVar19->implicitCallFlags = IVar2;
    AsmJSCompiler::OutputError(pSVar28,L"Asm.js Runtime Error : Params have side effects");
  }
  else {
LAB_008aa53c:
    *(DisableImplicitFlags *)(lVar9 + 0x1542) = DVar1;
    *(ImplicitCallFlags *)(lVar9 + 0x1570) = IVar2;
  }
LAB_008aa54d:
  pvVar15 = ProcessLinkFailedAsmJsModule(this);
  return pvVar15;
code_r0x008aa158:
  Memory::WriteBarrierPtr<void>::WriteBarrierSet
            (ptr_00 + (long)iVar6 + (ulong)pMVar21->location,pvVar15);
  iVar31 = iVar31 + 1;
  goto LAB_008aa0ff;
}

Assistant:

Var InterpreterStackFrame::ProcessAsmJsModule()
    {
        FunctionBody* asmJsModuleFunctionBody = GetFunctionBody();
        AsmJsModuleInfo* info = asmJsModuleFunctionBody->GetAsmJsModuleInfo();

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (Configuration::Global.flags.ForceAsmJsLinkFail)
        {
            AsmJSCompiler::OutputError(this->scriptContext, _u("Asm.js Runtime Error : Forcing link failure"));
            return this->ProcessLinkFailedAsmJsModule();
        }
#endif
        if (m_inSlotsCount != info->GetArgInCount() + 1)
        {
            // Error reparse without asm.js
            AsmJSCompiler::OutputError(this->scriptContext, _u("Asm.js Runtime Error : Invalid module argument count"));
            return this->ProcessLinkFailedAsmJsModule();
        }

        const AsmJsModuleMemory& moduleMemory = info->GetModuleMemory();
        Field(Var)* moduleMemoryPtr = RecyclerNewArray(scriptContext->GetRecycler(), Field(Var), moduleMemory.mMemorySize);
        Field(Var)* arrayBufferPtr = moduleMemoryPtr + moduleMemory.mArrayBufferOffset;
        Assert(moduleMemory.mArrayBufferOffset == AsmJsModuleMemory::MemoryTableBeginOffset);
        Field(Var)* stdLibPtr = moduleMemoryPtr + moduleMemory.mStdLibOffset;
        int* localIntSlots = (int*)(moduleMemoryPtr + moduleMemory.mIntOffset);
        float* localFloatSlots = (float*)(moduleMemoryPtr + moduleMemory.mFloatOffset);
        double* localDoubleSlots = (double*)(moduleMemoryPtr + moduleMemory.mDoubleOffset);
        Field(Var)* localFunctionImports = moduleMemoryPtr + moduleMemory.mFFIOffset;
        Field(Var)* localModuleFunctions = moduleMemoryPtr + moduleMemory.mFuncOffset;
        Field(Field(Var)*)* localFunctionTables = (Field(Field(Var)*)*)(moduleMemoryPtr + moduleMemory.mFuncPtrOffset);

        ThreadContext* threadContext = this->scriptContext->GetThreadContext();
        *stdLibPtr = (m_inSlotsCount > 1) ? m_inParams[1] : nullptr;

        Var foreign = (m_inSlotsCount > 2) ? m_inParams[2] : nullptr;
        *arrayBufferPtr = (m_inSlotsCount > 3) ? m_inParams[3] : nullptr;
        //cache the current state of the disable implicit call flag
        DisableImplicitFlags prevDisableImplicitFlags = threadContext->GetDisableImplicitFlags();
        ImplicitCallFlags saveImplicitcallFlags = threadContext->GetImplicitCallFlags();
        // Disable implicit calls to check if any of the VarImport or Function Import leads to implicit calls
        threadContext->DisableImplicitCall();
        threadContext->SetImplicitCallFlags(ImplicitCallFlags::ImplicitCall_None);
        bool checkParamResult = ASMLink::CheckParams(this->scriptContext, info, *stdLibPtr, foreign, *arrayBufferPtr);
        if (!checkParamResult)
        {
            // don't need to print, because checkParams will do it for us
            goto linkFailure;
        }
        else if (this->CheckAndResetImplicitCall(prevDisableImplicitFlags, saveImplicitcallFlags))
        {
            AsmJSCompiler::OutputError(this->scriptContext, _u("Asm.js Runtime Error : Params have side effects"));
            return this->ProcessLinkFailedAsmJsModule();
        }
        // Initialize Variables
        for (int i = 0; i < info->GetVarCount(); i++)
        {
            const auto& var = info->GetVar(i);
            const AsmJsVarType type(var.type);
            if (type.isInt())
            {
                localIntSlots[var.location] = var.initialiser.intInit;
            }
            else if (type.isFloat())
            {
                localFloatSlots[var.location] = var.initialiser.floatInit;
            }
            else if (type.isDouble())
            {
                localDoubleSlots[var.location] = var.initialiser.doubleInit;
            }
            else
            {
                Assert(UNREACHED);
            }
        }

        // Load constant variables
        for (int i = 0; i < info->GetVarImportCount(); i++)
        {
            const auto& import = info->GetVarImport(i);
            const AsmJsVarType type(import.type);
            // this might throw, but it would anyway in non-asm.js
            Var value = JavascriptOperators::OP_GetProperty(foreign, import.field, scriptContext);
            // check if there is implicit call and if there is implicit call then clear the disableimplicitcall flag
            if (this->CheckAndResetImplicitCall(prevDisableImplicitFlags, saveImplicitcallFlags))
            {
                AsmJSCompiler::OutputError(this->scriptContext, _u("Asm.js Runtime Error : Accessing var import %s has side effects"), this->scriptContext->GetPropertyName(import.field)->GetBuffer());
                return this->ProcessLinkFailedAsmJsModule();
            }
            if (CONFIG_FLAG(AsmJsEdge))
            {
                // emscripten had a bug which caused this check to fail in some circumstances, so this check fails for some demos
                if (!TaggedNumber::Is(value) && (!VarIs<RecyclableObject>(value) || DynamicType::Is(VarTo<RecyclableObject>(value)->GetTypeId())))
                {
                    AsmJSCompiler::OutputError(this->scriptContext, _u("Asm.js Runtime Error : Var import %s must be primitive"), this->scriptContext->GetPropertyName(import.field)->GetBuffer());
                    goto linkFailure;
                }
            }

            if (type.isInt())
            {
                int val = JavascriptMath::ToInt32(value, scriptContext);
                localIntSlots[import.location] = val;
            }
            else if (type.isFloat())
            {
                float val = (float)JavascriptConversion::ToNumber(value, scriptContext);
                localFloatSlots[import.location] = val;
            }
            else if (type.isDouble())
            {
                double val = JavascriptConversion::ToNumber(value, scriptContext);
                localDoubleSlots[import.location] = val;
            }

            // check for implicit call after converting to number
            if (this->CheckAndResetImplicitCall(prevDisableImplicitFlags, saveImplicitcallFlags))
            {
                // Runtime error
                AsmJSCompiler::OutputError(this->scriptContext, _u("Asm.js Runtime Error : Accessing var import %s has side effects"), this->scriptContext->GetPropertyName(import.field)->GetBuffer());
                return this->ProcessLinkFailedAsmJsModule();
            }
        }
        // Load external functions
        for (int i = 0; i < info->GetFunctionImportCount(); i++)
        {
            const auto& import = info->GetFunctionImport(i);
            // this might throw, but it would anyway in non-asm.js
            Var importFunc = JavascriptOperators::OP_GetProperty(foreign, import.field, scriptContext);
            // check if there is implicit call and if there is implicit call then clear the disableimplicitcall flag
            if (this->CheckAndResetImplicitCall(prevDisableImplicitFlags, saveImplicitcallFlags))
            {
                AsmJSCompiler::OutputError(this->scriptContext, _u("Asm.js Runtime Error : Accessing foreign function import %s has side effects"), this->scriptContext->GetPropertyName(import.field)->GetBuffer());
                return this->ProcessLinkFailedAsmJsModule();
            }
            if (!VarIs<JavascriptFunction>(importFunc))
            {
                AsmJSCompiler::OutputError(this->scriptContext, _u("Asm.js Runtime Error : Foreign function import %s is not a function"), this->scriptContext->GetPropertyName(import.field)->GetBuffer());
                goto linkFailure;
            }
            localFunctionImports[import.location] = importFunc;
        }

        threadContext->SetDisableImplicitFlags(prevDisableImplicitFlags);
        threadContext->SetImplicitCallFlags(saveImplicitcallFlags);
        // scope
        {
            FrameDisplay* pDisplay = RecyclerNewPlus(scriptContext->GetRecycler(), sizeof(void*), FrameDisplay, 0);
            //DynamicObject* asmModule = scriptContext->GetLibrary()->CreateObject(false, 1);
            //JavascriptOperators::OP_SetProperty(asmModule, PropertyIds::module, moduleMemoryPtr, scriptContext);
            //pDisplay->SetItem(0, this->function);
            for (int i = 0; i < info->GetFunctionCount(); i++)
            {
                const auto& modFunc = info->GetFunction(i);

                // TODO: add more runtime checks here
                FunctionInfoPtrPtr functionInfo = m_functionBody->GetNestedFuncReference(i);

                AsmJsScriptFunction* scriptFuncObj = AsmJsScriptFunction::OP_NewAsmJsFunc(pDisplay, functionInfo);
                localModuleFunctions[modFunc.location] = scriptFuncObj;

                if (scriptFuncObj->GetDynamicType()->GetEntryPoint() == DefaultDeferredDeserializeThunk)
                {
                    JavascriptFunction::DeferredDeserialize(scriptFuncObj);
                }

                scriptFuncObj->GetDynamicType()->SetEntryPoint(AsmJsExternalEntryPoint);
                scriptFuncObj->GetFunctionBody()->GetAsmJsFunctionInfo()->SetModuleFunctionBody(asmJsModuleFunctionBody);
                scriptFuncObj->SetModuleEnvironment(moduleMemoryPtr);
                if (!info->IsRuntimeProcessed())
                {
                    // don't reset entrypoint upon relinking
                    FunctionEntryPointInfo* entrypointInfo = (FunctionEntryPointInfo*)scriptFuncObj->GetEntryPointInfo();
                    entrypointInfo->SetIsAsmJSFunction(true);

#if DYNAMIC_INTERPRETER_THUNK
                    if (!PHASE_ON1(AsmJsJITTemplatePhase))
                    {
                        entrypointInfo->jsMethod = AsmJsDefaultEntryThunk;
                    }
#endif
                }
            }
        }

        // Initialize function table arrays
        for (int i = 0; i < info->GetFunctionTableCount(); i++)
        {
            const auto& modFuncTable = info->GetFunctionTable(i);
            Field(Var)* funcTableArray = RecyclerNewArray(scriptContext->GetRecycler(), Field(Var), modFuncTable.size);
            for (uint j = 0; j < modFuncTable.size; j++)
            {
                // get the module function index
                const RegSlot index = modFuncTable.moduleFunctionIndex[j];
                // assign the module function pointer to the array
                Var functionPtr = localModuleFunctions[index];
                funcTableArray[j] = functionPtr;
            }
            localFunctionTables[i] = funcTableArray;
        }
        // Do MTJRC/MAIC:0 check
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (
            (PHASE_ON1(Js::AsmJsJITTemplatePhase) && CONFIG_FLAG(MaxTemplatizedJitRunCount) == 0) ||
            (!PHASE_ON1(Js::AsmJsJITTemplatePhase) && (CONFIG_FLAG(MaxAsmJsInterpreterRunCount) == 0 || CONFIG_FLAG(ForceNative)))
            )
        {
            if (PHASE_TRACE1(AsmjsEntryPointInfoPhase))
            {
                Output::Print(_u("%s Scheduling For Full JIT at callcount:%d\n"), asmJsModuleFunctionBody->GetDisplayName(), 0);
                Output::Flush();
            }
            for (int i = 0; i < info->GetFunctionCount(); i++)
            {
                ScriptFunction* functionObj = (ScriptFunction*)PointerValue(localModuleFunctions[i]);
                AnalysisAssert(functionObj != nullptr);
                // don't want to generate code for APIs like changeHeap
                if (functionObj->GetEntryPoint() == Js::AsmJsExternalEntryPoint)
                {
                    WAsmJs::JitFunctionIfReady(functionObj);
                }
            }
        }
#endif

        info->SetIsRuntimeProcessed(true);

        // create export object
        if (info->GetExportsCount())
        {
            Var newObj = JavascriptOperators::NewScObjectLiteral(GetScriptContext(), info->GetExportsIdArray(),
                this->GetFunctionBody()->GetObjectLiteralTypeRef(0));
            for (int i = 0; i < info->GetExportsCount(); i++)
            {
                auto ex = info->GetExport(i);
                Var func = localModuleFunctions[*ex.location];
                JavascriptOperators::OP_InitProperty(newObj, *ex.id, func);
            }
            SetReg((RegSlot)0, newObj);
            return newObj;
        }


        // export only 1 function
        {
            Var exportFunc = localModuleFunctions[info->GetExportFunctionIndex()];
            SetReg((RegSlot)0, exportFunc);
            return exportFunc;
        }

    linkFailure:
        threadContext->SetDisableImplicitFlags(prevDisableImplicitFlags);
        threadContext->SetImplicitCallFlags(saveImplicitcallFlags);
        return this->ProcessLinkFailedAsmJsModule();
    }